

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O3

void __thiscall
duckdb::roaring::RoaringScanState::RoaringScanState(RoaringScanState *this,ColumnSegment *segment)

{
  BufferHandle *this_00;
  pointer *ppCVar1;
  long *plVar2;
  iterator __position;
  iterator __position_00;
  ContainerMetadataCollection *collection;
  BufferManager *pBVar3;
  ulong uVar4;
  idx_t container_count;
  ContainerMetadata metadata;
  idx_t position;
  ContainerMetadataCollectionScanner scanner;
  ContainerMetadata local_6c;
  unsigned_long local_68;
  ContainerMetadataCollection *local_60;
  BufferHandle *local_58;
  ContainerMetadataCollectionScanner local_50;
  
  (this->super_SegmentScanState)._vptr_SegmentScanState =
       (_func_int **)&PTR__RoaringScanState_02444838;
  this_00 = &this->handle;
  BufferHandle::BufferHandle(this_00);
  this->segment = segment;
  (this->current_container).
  super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
  .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl =
       (ContainerScanState *)0x0;
  local_60 = &this->metadata_collection;
  local_58 = this_00;
  ContainerMetadataCollection::ContainerMetadataCollection(local_60);
  (this->data_start_position).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->data_start_position).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->container_metadata).
  super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
  .
  super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data_start_position).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->container_metadata).
  super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
  .
  super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->container_metadata).
  super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
  .
  super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pBVar3 = BufferManager::GetBufferManager(segment->db);
  (*pBVar3->_vptr_BufferManager[7])(&local_50,pBVar3,&segment->block);
  BufferHandle::operator=(this_00,(BufferHandle *)&local_50);
  BufferHandle::~BufferHandle((BufferHandle *)&local_50);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  collection = local_60;
  plVar2 = (long *)(((this->handle).node.ptr)->buffer + segment->offset);
  this->data_ptr = (data_ptr_t)(plVar2 + 1);
  uVar4 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  container_count = ((uVar4 >> 0xb) + 1) - (ulong)((uVar4 & 0x7ff) == 0);
  ContainerMetadataCollection::Deserialize
            (local_60,(data_ptr_t)((long)(plVar2 + 1) + *plVar2),container_count);
  ContainerMetadataCollectionScanner::ContainerMetadataCollectionScanner(&local_50,collection);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->data_start_position,
             container_count);
  local_68 = 0;
  if (container_count != 0) {
    do {
      local_6c = ContainerMetadataCollectionScanner::GetNext(&local_50);
      __position._M_current =
           (this->container_metadata).
           super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
           .
           super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->container_metadata).
          super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
          .
          super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<duckdb::roaring::ContainerMetadata,std::allocator<duckdb::roaring::ContainerMetadata>>
        ::_M_realloc_insert<duckdb::roaring::ContainerMetadata_const&>
                  ((vector<duckdb::roaring::ContainerMetadata,std::allocator<duckdb::roaring::ContainerMetadata>>
                    *)&this->container_metadata,__position,&local_6c);
      }
      else {
        *__position._M_current = local_6c;
        ppCVar1 = &(this->container_metadata).
                   super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
                   .
                   super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
      if (local_6c.container_type == RUN_CONTAINER) {
        if (local_6c.count < 4) {
          local_68 = local_68 + 3 & 0xfffffffffffffffc;
        }
      }
      else if (((uint)local_6c & 0xff) == 1) {
        if (local_6c.count < 8) {
          local_68 = local_68 + 1 & 0xfffffffffffffffe;
        }
      }
      else if (((uint)local_6c & 0xff) == 2) {
        local_68 = local_68 + 7 & 0xfffffffffffffff8;
      }
      __position_00._M_current =
           (this->data_start_position).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->data_start_position).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->data_start_position
                   ,__position_00,&local_68);
      }
      else {
        *__position_00._M_current = local_68;
        (this->data_start_position).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      if (local_6c.container_type == BITSET_CONTAINER) {
        uVar4 = 0x100;
      }
      else if (local_6c.container_type == RUN_CONTAINER) {
        uVar4 = (ulong)((uint)local_6c.count * 4);
        if (3 < local_6c.count) {
          uVar4 = (ulong)local_6c.count * 2 + 8;
        }
      }
      else {
        uVar4 = (ulong)((uint)local_6c.count + (uint)local_6c.count);
        if (7 < local_6c.count) {
          uVar4 = (ulong)local_6c.count + 8;
        }
      }
      local_68 = local_68 + uVar4;
      container_count = container_count - 1;
    } while (container_count != 0);
  }
  return;
}

Assistant:

RoaringScanState::RoaringScanState(ColumnSegment &segment) : segment(segment) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	handle = buffer_manager.Pin(segment.block);
	auto base_ptr = handle.Ptr() + segment.GetBlockOffset();
	data_ptr = base_ptr + sizeof(idx_t);

	// Deserialize the container metadata for this segment
	auto metadata_offset = Load<idx_t>(base_ptr);
	auto metadata_ptr = data_ptr + metadata_offset;

	auto segment_count = segment.count.load();
	auto container_count = segment_count / ROARING_CONTAINER_SIZE;
	if (segment_count % ROARING_CONTAINER_SIZE != 0) {
		container_count++;
	}
	metadata_collection.Deserialize(metadata_ptr, container_count);
	ContainerMetadataCollectionScanner scanner(metadata_collection);
	data_start_position.reserve(container_count);
	idx_t position = 0;
	for (idx_t i = 0; i < container_count; i++) {
		auto metadata = scanner.GetNext();
		container_metadata.push_back(metadata);
		if (metadata.IsUncompressed()) {
			position = AlignValue<idx_t>(position);
		} else if (metadata.IsArray() && metadata.Cardinality() < COMPRESSED_ARRAY_THRESHOLD) {
			position = AlignValue<idx_t, sizeof(uint16_t)>(position);
		} else if (metadata.IsRun() && metadata.NumberOfRuns() < COMPRESSED_RUN_THRESHOLD) {
			position = AlignValue<idx_t, sizeof(RunContainerRLEPair)>(position);
		}
		data_start_position.push_back(position);
		position += SkipVector(metadata);
	}
}